

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denialofservice_tests.cpp
# Opt level: O1

CService * ip(CService *__return_storage_ptr__,uint32_t i)

{
  CChainParams *pCVar1;
  long in_FS_OFFSET;
  in_addr s;
  in_addr local_34;
  direct_or_indirect local_30;
  uint local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_34.s_addr = i;
  CNetAddr::CNetAddr((CNetAddr *)&local_30.indirect_contents,&local_34);
  pCVar1 = Params();
  CService::CService(__return_storage_ptr__,(CNetAddr *)&local_30.indirect_contents,
                     pCVar1->nDefaultPort);
  if (0x10 < local_20) {
    free(local_30.indirect_contents.indirect);
    local_30.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static CService ip(uint32_t i)
{
    struct in_addr s;
    s.s_addr = i;
    return CService(CNetAddr(s), Params().GetDefaultPort());
}